

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::NetAlias>::emplace_back<slang::ast::NetAlias>
          (SmallVectorBase<slang::ast::NetAlias> *this,NetAlias *args)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  undefined8 *puVar3;
  size_type sVar4;
  ulong uVar5;
  pointer p;
  ValueSymbol *pVVar6;
  Expression *pEVar7;
  unsigned_long uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pNVar12;
  pointer pNVar13;
  pointer pNVar14;
  long lVar15;
  long lVar16;
  pointer __src;
  ulong uVar17;
  long lVar18;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pVVar6 = (args->sym).ptr;
    pEVar7 = (args->expr).ptr;
    uVar8 = (args->bounds).second;
    (__src->bounds).first = (args->bounds).first;
    (__src->bounds).second = uVar8;
    (__src->sym).ptr = pVVar6;
    (__src->expr).ptr = pEVar7;
    sVar4 = this->len;
    this->len = sVar4 + 1;
    return this->data_ + sVar4;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar17 = this->len + 1;
  uVar5 = this->cap;
  if (uVar17 < uVar5 * 2) {
    uVar17 = uVar5 * 2;
  }
  if (0x3ffffffffffffff - uVar5 < uVar5) {
    uVar17 = 0x3ffffffffffffff;
  }
  lVar18 = (long)__src - (long)this->data_;
  pNVar14 = (pointer)operator_new(uVar17 << 5);
  pVVar6 = (args->sym).ptr;
  pEVar7 = (args->expr).ptr;
  uVar8 = (args->bounds).second;
  puVar2 = (unsigned_long *)((long)pNVar14 + lVar18 + 0x10);
  *puVar2 = (args->bounds).first;
  puVar2[1] = uVar8;
  *(undefined8 *)((long)pNVar14 + lVar18) = pVVar6;
  ((undefined8 *)((long)pNVar14 + lVar18))[1] = pEVar7;
  p = this->data_;
  lVar15 = this->len * 0x20;
  lVar16 = (long)p + (lVar15 - (long)__src);
  pNVar12 = p;
  pNVar13 = pNVar14;
  if (lVar16 == 0) {
    if (this->len != 0) {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->sym).ptr + lVar16);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->bounds).first + lVar16);
        uVar11 = puVar1[1];
        puVar3 = (undefined8 *)((long)&(pNVar14->bounds).first + lVar16);
        *puVar3 = *puVar1;
        puVar3[1] = uVar11;
        puVar1 = (undefined8 *)((long)&(pNVar14->sym).ptr + lVar16);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        lVar16 = lVar16 + 0x20;
      } while (lVar15 != lVar16);
    }
  }
  else {
    for (; pNVar12 != __src; pNVar12 = pNVar12 + 1) {
      pVVar6 = (pNVar12->sym).ptr;
      pEVar7 = (pNVar12->expr).ptr;
      uVar8 = (pNVar12->bounds).second;
      (pNVar13->bounds).first = (pNVar12->bounds).first;
      (pNVar13->bounds).second = uVar8;
      (pNVar13->sym).ptr = pVVar6;
      (pNVar13->expr).ptr = pEVar7;
      pNVar13 = pNVar13 + 1;
    }
    memcpy((void *)((long)pNVar14 + lVar18 + 0x20),__src,
           (lVar16 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar17;
  this->data_ = pNVar14;
  return (reference)((long)pNVar14 + lVar18);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }